

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_get_tensor(ggml_context *ctx,char *name)

{
  void *pvVar1;
  size_t sVar2;
  int iVar3;
  ggml_object *pgVar4;
  
  pgVar4 = ctx->objects_begin;
  if (pgVar4 != (ggml_object *)0x0) {
    pvVar1 = ctx->mem_buffer;
    do {
      if (pgVar4->type == GGML_OBJECT_TYPE_TENSOR) {
        sVar2 = pgVar4->offs;
        iVar3 = strcmp((char *)((long)pvVar1 + sVar2 + 0x100),name);
        if (iVar3 == 0) {
          return (ggml_tensor *)((long)pvVar1 + sVar2);
        }
      }
      pgVar4 = pgVar4->next;
    } while (pgVar4 != (ggml_object *)0x0);
  }
  return (ggml_tensor *)0x0;
}

Assistant:

struct ggml_tensor * ggml_get_tensor(struct ggml_context * ctx, const char * name) {
    struct ggml_object * obj = ctx->objects_begin;

    char * const mem_buffer = ctx->mem_buffer;

    while (obj != NULL) {
        if (obj->type == GGML_OBJECT_TYPE_TENSOR) {
            struct ggml_tensor * cur = (struct ggml_tensor *)(mem_buffer + obj->offs);
            if (strcmp(cur->name, name) == 0) {
                return cur;
            }
        }

        obj = obj->next;
    }

    return NULL;
}